

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O3

void __thiscall Annotations::Remove(Annotations *this,int id)

{
  size_type *psVar1;
  int iVar2;
  char *zErrMsg;
  char sql [1024];
  Annotations local_420 [14];
  
  local_420[0].filename._M_dataplus._M_p = (pointer)0x0;
  psVar1 = &local_420[0].filename._M_string_length;
  sqlite3_snprintf(0x400,psVar1,"UPDATE annotations set visible = 0 where id=%d;",id);
  iVar2 = sqlite3_exec(this->sqldb,psVar1,0,0,local_420);
  if (iVar2 == 0) {
    if (this->debug != false) {
      fwrite("Records created successfully\n",0x1d,1,_stdout);
    }
  }
  else {
    if (this->debug != false) {
      Remove(local_420);
    }
    sqlite3_free(local_420[0].filename._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Annotations::Remove(int id) {
	char sql[1024];
	char *zErrMsg = 0;
	int r;

	sqlite3_snprintf(sizeof(sql), sql, "UPDATE annotations set visible = 0 where id=%d;", id);
	r = sqlite3_exec(sqldb, sql, NULL, 0, &zErrMsg);
	if (r != SQLITE_OK) {
		if (debug) fprintf(stderr, "SQL error: %s\n", zErrMsg);
		sqlite3_free(zErrMsg);
	} else {
		if (debug) fprintf(stdout, "Records created successfully\n");
	}
}